

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::VerifyUTF8(internal *this,StringPiece str,char *field_name)

{
  bool bVar1;
  char *local_38;
  undefined8 local_30;
  char local_28 [16];
  
  local_38 = local_28;
  if (this == (internal *)0x0) {
    local_30 = 0;
    local_28[0] = '\0';
    local_30._0_4_ = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,this,str.ptr_ + (long)this);
  }
  bVar1 = IsStructurallyValidUTF8(local_38,(int)local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  if (!bVar1) {
    PrintUTF8ErrorLog((char *)str.length_,"parsing",false);
  }
  return bVar1;
}

Assistant:

bool VerifyUTF8(StringPiece str, const char* field_name) {
  if (!IsStructurallyValidUTF8(str)) {
    PrintUTF8ErrorLog(field_name, "parsing", false);
    return false;
  }
  return true;
}